

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ushort uVar1;
  Data *pDVar2;
  size_type __len1;
  char *__name;
  addrinfo *__ai;
  int iVar3;
  size_t __len2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ushort in_R8W;
  int iVar4;
  uint __len_00;
  addrinfo *paVar5;
  string __str;
  addrinfo *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  addrinfo *local_38;
  
  pDVar2 = this->m_data;
  __len1 = (pDVar2->remote_host)._M_string_length;
  __len2 = strlen((char *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pDVar2->remote_host,0,__len1,(char *)CONCAT44(in_register_00000034,__fd),__len2);
  pDVar2 = this->m_data;
  pDVar2->remote_port = (unsigned_short)__addr;
  __name = (pDVar2->remote_host)._M_dataplus._M_p;
  uVar1 = pDVar2->remote_port;
  __len_00 = 1;
  if (((9 < uVar1) && (__len_00 = 2, 99 < uVar1)) && (__len_00 = 3, 999 < uVar1)) {
    __len_00 = 5 - (uVar1 < 10000);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,(ulong)__len_00,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,__len_00,(uint)uVar1);
  local_38 = (addrinfo *)0x0;
  getaddrinfo(__name,local_58._M_dataplus._M_p,(addrinfo *)0x0,&local_38);
  __ai = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (__ai == (addrinfo *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    paVar5 = __ai;
    do {
      if (CONCAT44(in_register_0000000c,__len) == 0) {
        iVar3 = socket(paVar5->ai_family,this->m_data->sockType,this->m_data->sockProto);
        this->m_data->rawSock = iVar3;
        if (iVar3 != -1) goto LAB_00137fe4;
      }
      else {
        iVar3 = bind(this,__len,(sockaddr *)(ulong)in_R8W,0);
        if ((char)iVar3 == '\0') goto LAB_0013802a;
LAB_00137fe4:
        iVar3 = ::connect(this->m_data->rawSock,paVar5->ai_addr,paVar5->ai_addrlen);
        if (iVar3 != -1) {
          iVar4 = 1;
          goto LAB_0013802a;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
      }
      paVar5 = paVar5->ai_next;
    } while (paVar5 != (addrinfo *)0x0);
    iVar4 = 0;
LAB_0013802a:
    freeaddrinfo(__ai);
  }
  return iVar4;
}

Assistant:

bool Jupiter::Socket::connect(const char *hostname, unsigned short iPort, const char *clientAddress, unsigned short clientPort) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init())
		return false;
#endif // _WIN32
	m_data->remote_host = hostname;
	m_data->remote_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->remote_host.c_str(), std::to_string(m_data->remote_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			if (clientAddress != nullptr) {
				// bind will initialize our socket
				if (Jupiter::Socket::bind(clientAddress, clientPort, false) == false)
					break;
			}
			else {
				m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
				if (m_data->rawSock == INVALID_SOCKET) {
					info = info->ai_next;
					continue;
				}
			}

			if (::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}